

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protostream_objectsource.cc
# Opt level: O3

Status * __thiscall
google::protobuf::util::converter::ProtoStreamObjectSource::RenderUInt32
          (Status *__return_storage_ptr__,ProtoStreamObjectSource *this,ProtoStreamObjectSource *os,
          Type *type,StringPiece field_name,ObjectWriter *ow)

{
  byte bVar1;
  uint32 uVar2;
  uint first_byte_or_zero;
  ulong uVar3;
  byte *pbVar4;
  byte *pbVar5;
  CodedInputStream *pCVar6;
  
  pCVar6 = this->stream_;
  pbVar4 = pCVar6->buffer_;
  if (pbVar4 < pCVar6->buffer_end_) {
    uVar2 = (uint32)*pbVar4;
    if ((char)*pbVar4 < '\0') goto LAB_00316fc0;
    pCVar6->buffer_ = pbVar4 + 1;
  }
  else {
    uVar2 = 0;
LAB_00316fc0:
    uVar2 = io::CodedInputStream::ReadTagFallback(pCVar6,uVar2);
  }
  pCVar6->last_tag_ = uVar2;
  if (uVar2 == 0) {
    uVar3 = 0;
    goto LAB_0031705e;
  }
  pCVar6 = this->stream_;
  pbVar5 = pCVar6->buffer_;
  pbVar4 = pCVar6->buffer_end_;
  if (pbVar5 < pbVar4) {
    bVar1 = *pbVar5;
    uVar3 = (ulong)bVar1;
    uVar2 = (uint32)bVar1;
    if ((char)bVar1 < '\0') goto LAB_0031700c;
    pbVar5 = pbVar5 + 1;
    pCVar6->buffer_ = pbVar5;
  }
  else {
    uVar2 = 0;
LAB_0031700c:
    uVar3 = io::CodedInputStream::ReadVarint32Fallback(pCVar6,uVar2);
    pCVar6 = this->stream_;
    pbVar5 = pCVar6->buffer_;
    pbVar4 = pCVar6->buffer_end_;
  }
  if (pbVar5 < pbVar4) {
    first_byte_or_zero = (uint)*pbVar5;
    if ((char)*pbVar5 < '\0') goto LAB_00317049;
    pCVar6->buffer_ = pbVar5 + 1;
  }
  else {
    first_byte_or_zero = 0;
LAB_00317049:
    first_byte_or_zero = io::CodedInputStream::ReadTagFallback(pCVar6,first_byte_or_zero);
  }
  pCVar6->last_tag_ = first_byte_or_zero;
LAB_0031705e:
  (**(code **)(*(long *)field_name.length_ + 0x40))
            ((long *)field_name.length_,type,field_name.ptr_,uVar3 & 0xffffffff);
  Status::Status(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

Status ProtoStreamObjectSource::RenderUInt32(const ProtoStreamObjectSource* os,
                                             const google::protobuf::Type& type,
                                             StringPiece field_name,
                                             ObjectWriter* ow) {
  uint32 tag = os->stream_->ReadTag();
  uint32 buffer32 = 0;  // default value of UInt32 wrapper value
  if (tag != 0) {
    os->stream_->ReadVarint32(&buffer32);
    os->stream_->ReadTag();
  }
  ow->RenderUint32(field_name, bit_cast<uint32>(buffer32));
  return util::Status();
}